

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx.cpp
# Opt level: O1

int __thiscall
ncnn::Convolution_x86_avx::forwardDilation_x86
          (Convolution_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined1 auVar1 [32];
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  size_t _elemsize;
  _func_int *p_Var14;
  _func_int **pp_Var15;
  size_t sVar16;
  size_t sVar17;
  Layer *pLVar18;
  ulong uVar19;
  int *piVar20;
  int iVar21;
  ulong uVar22;
  Allocator *pAVar23;
  ulong uVar24;
  Allocator *pAVar25;
  undefined4 *puVar26;
  ulong uVar27;
  int iVar28;
  int iVar29;
  uint _w;
  long lVar30;
  undefined4 *puVar31;
  long lVar32;
  int iVar33;
  undefined4 *puVar34;
  ulong uVar35;
  uint _h;
  bool bVar36;
  Option opt_g;
  long local_180;
  long local_178;
  Mat local_158;
  Mat local_108;
  long local_b8;
  ulong local_b0;
  long local_a8;
  long local_a0;
  ulong local_98;
  ulong local_90;
  long local_88;
  long local_80;
  undefined8 local_78;
  Allocator *pAStack_70;
  undefined1 auStack_68 [16];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined8 uVar2;
  undefined4 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  
  iVar8 = bottom_blob->w;
  iVar9 = bottom_blob->h;
  _elemsize = bottom_blob->elemsize;
  p_Var14 = this->_vptr_Convolution_x86_avx[-3];
  iVar10 = *(int *)((long)&(this->weight_winograd23_data).w + (long)p_Var14);
  iVar11 = *(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var14);
  uVar12 = *(uint *)((long)&(this->weight_winograd23_data).d + (long)p_Var14);
  uVar22 = (ulong)uVar12;
  iVar29 = (iVar10 + -1) * uVar12 + 1;
  iVar21 = (iVar8 - iVar29) / iVar11;
  iVar28 = iVar21 + 1;
  Mat::create(top_blob,iVar28,(iVar9 - iVar29) / iVar11 + 1,
              *(int *)((long)&(this->weight_winograd23_data).dims + (long)p_Var14),_elemsize,
              opt->blob_allocator);
  iVar29 = -100;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    local_108.cstep = 0;
    local_158.data = (Allocator *)0x0;
    local_158.refcount._0_4_ = 0;
    local_158.refcount._4_4_ = 0;
    local_158.elemsize._0_4_ = 0;
    local_158.elempack = 0;
    local_108._48_8_ = SUB168(ZEXT816(0) << 0x40,4);
    local_158.cstep = 0;
    bVar36 = 0 < (int)uVar12;
    local_158.elemsize._4_4_ = (int)local_158.refcount;
    local_158.allocator = (Allocator *)local_158.data;
    local_158.dims = (int)local_158.refcount;
    local_158.w = local_158.refcount._4_4_;
    local_158._48_8_ = local_108._48_8_;
    local_158.c = local_158.elempack;
    local_108.data = local_158.data;
    local_108.refcount._0_4_ = (int)local_158.refcount;
    local_108.refcount._4_4_ = local_158.refcount._4_4_;
    local_108.elemsize._0_4_ = (undefined4)local_158.elemsize;
    local_108.elemsize._4_4_ = (int)local_158.refcount;
    local_108.elempack = local_158.elempack;
    local_108.allocator = (Allocator *)local_158.data;
    local_108.dims = (int)local_158.refcount;
    local_108.w = local_158.refcount._4_4_;
    local_108.c = local_158.elempack;
    if (0 < (int)uVar12) {
      local_b8 = (long)iVar21 * 4 + 4;
      local_80 = (long)(int)(iVar28 * uVar12) << 2;
      local_180 = 0;
      local_178 = 0;
      uVar24 = 0;
      do {
        uVar19 = (long)(int)((uVar12 + iVar9 + -1) - (int)uVar24) / (long)(int)uVar12;
        iVar21 = (int)uVar19;
        uVar27 = (long)(iVar21 - iVar10) / (long)iVar11;
        local_90 = uVar27 & 0xffffffff;
        _h = (int)uVar27 + 1;
        uVar27 = 0;
        local_b0 = uVar24;
        local_a8 = local_178;
        local_a0 = local_180;
        do {
          uVar24 = (long)(int)((uVar12 + iVar8 + -1) - (int)uVar27) / (long)(int)uVar12;
          iVar28 = (int)uVar24;
          iVar29 = (iVar28 - iVar10) / iVar11;
          local_98 = uVar27;
          Mat::create(&local_108,iVar28,iVar21,bottom_blob->c,_elemsize,opt->workspace_allocator);
          if (((Allocator *)local_108.data == (Allocator *)0x0) ||
             ((long)local_108.c * local_108.cstep == 0)) {
LAB_0023c286:
            iVar29 = -100;
            if (bVar36) goto LAB_0023c2b9;
            goto LAB_0023c29a;
          }
          _w = iVar29 + 1;
          Mat::create(&local_158,_w,_h,
                      *(int *)((long)&(this->weight_winograd23_data).dims +
                              (long)this->_vptr_Convolution_x86_avx[-3]),_elemsize,
                      opt->workspace_allocator);
          if (((Allocator *)local_158.data == (Allocator *)0x0) ||
             ((long)local_158.c * local_158.cstep == 0)) goto LAB_0023c286;
          iVar13 = bottom_blob->c;
          if (0 < (long)iVar13) {
            lVar30 = (long)bottom_blob->data + local_178;
            local_88 = bottom_blob->cstep * bottom_blob->elemsize;
            lVar32 = 0;
            pAVar23 = (Allocator *)local_108.data;
            do {
              if (0 < iVar21) {
                iVar33 = 0;
                uVar27 = 0;
                pAVar25 = pAVar23;
                do {
                  if (0 < iVar28) {
                    puVar26 = (undefined4 *)(lVar30 + (long)iVar33 * 4);
                    uVar35 = 0;
                    do {
                      *(undefined4 *)((long)&pAVar25->_vptr_Allocator + uVar35 * 4) = *puVar26;
                      uVar35 = uVar35 + 1;
                      puVar26 = puVar26 + uVar22;
                    } while ((uVar24 & 0xffffffff) != uVar35);
                  }
                  uVar27 = uVar27 + 1;
                  iVar33 = iVar33 + uVar12 * iVar8;
                  pAVar25 = (Allocator *)((long)&pAVar25->_vptr_Allocator + (long)iVar28 * 4);
                } while (uVar27 != (uVar19 & 0xffffffff));
              }
              lVar32 = lVar32 + 1;
              lVar30 = lVar30 + local_88;
              pAVar23 = (Allocator *)
                        ((long)&pAVar23->_vptr_Allocator +
                        local_108.cstep *
                        CONCAT44(local_108.elemsize._4_4_,(undefined4)local_108.elemsize));
            } while (lVar32 != iVar13);
          }
          auVar1[0] = opt->lightmode;
          auVar1._1_3_ = *(undefined3 *)&opt->field_0x1;
          auVar1._4_4_ = opt->num_threads;
          auVar1._8_8_ = opt->blob_allocator;
          uVar2 = opt->workspace_allocator;
          uVar3 = opt->openmp_blocktime;
          uVar4 = opt->use_winograd_convolution;
          uVar5 = opt->use_sgemm_convolution;
          uVar6 = opt->use_int8_inference;
          uVar7 = opt->use_vulkan_compute;
          auVar1[0x1f] = uVar7;
          auVar1[0x1e] = uVar6;
          auVar1[0x1d] = uVar5;
          auVar1[0x1c] = uVar4;
          auVar1._24_4_ = uVar3;
          auVar1._16_8_ = uVar2;
          local_58._0_1_ = opt->use_bf16_storage;
          local_58._1_1_ = opt->use_fp16_packed;
          local_58._2_1_ = opt->use_fp16_storage;
          local_58._3_1_ = opt->use_fp16_arithmetic;
          local_58._4_1_ = opt->use_int8_packed;
          local_58._5_1_ = opt->use_int8_storage;
          local_58._6_1_ = opt->use_int8_arithmetic;
          local_58._7_1_ = opt->use_packing_layout;
          uStack_50._0_1_ = opt->use_shader_pack8;
          uStack_50._1_1_ = opt->use_subgroup_basic;
          uStack_50._2_1_ = opt->use_subgroup_vote;
          uStack_50._3_1_ = opt->use_subgroup_ballot;
          uStack_50._4_1_ = opt->use_subgroup_shuffle;
          uStack_50._5_1_ = opt->use_image_storage;
          uStack_50._6_1_ = opt->use_tensor_storage;
          uStack_50._7_1_ = opt->use_reserved_0;
          uStack_48._0_4_ = opt->flush_denormals;
          uStack_48._4_1_ = opt->use_local_pool_allocator;
          uStack_48._5_1_ = opt->use_shader_local_memory;
          uStack_48._6_1_ = opt->use_cooperative_matrix;
          uStack_48._7_1_ = opt->use_winograd23_convolution;
          uStack_40._0_1_ = opt->use_winograd43_convolution;
          uStack_40._1_1_ = opt->use_winograd63_convolution;
          uStack_40._2_1_ = opt->use_a53_a55_optimized_kernel;
          uStack_40._3_1_ = opt->use_reserved_7;
          uStack_40._4_1_ = opt->use_reserved_8;
          uStack_40._5_1_ = opt->use_reserved_9;
          uStack_40._6_1_ = opt->use_reserved_10;
          uStack_40._7_1_ = opt->use_reserved_11;
          local_78 = auVar1._0_8_;
          pAStack_70 = local_158.allocator;
          auStack_68 = auVar1._16_16_;
          (*this->convolution_dilation1->_vptr_Layer[7])
                    (this->convolution_dilation1,&local_108,&local_158,&local_78);
          pp_Var15 = this->_vptr_Convolution_x86_avx;
          if (0 < *(int *)((long)&(this->weight_winograd23_data).dims + (long)pp_Var15[-3])) {
            sVar16 = top_blob->cstep;
            puVar26 = (undefined4 *)((long)top_blob->data + local_180);
            sVar17 = top_blob->elemsize;
            lVar30 = 0;
            pAVar23 = (Allocator *)local_158.data;
            do {
              if (-1 < (int)local_90) {
                uVar24 = 0;
                puVar31 = puVar26;
                pAVar25 = pAVar23;
                do {
                  if (-1 < iVar29) {
                    uVar27 = 0;
                    puVar34 = puVar31;
                    do {
                      *puVar34 = *(undefined4 *)((long)&pAVar25->_vptr_Allocator + uVar27 * 4);
                      uVar27 = uVar27 + 1;
                      puVar34 = puVar34 + uVar22;
                    } while (_w != uVar27);
                  }
                  uVar24 = uVar24 + 1;
                  puVar31 = (undefined4 *)((long)puVar31 + local_80);
                  pAVar25 = (Allocator *)((long)&pAVar25->_vptr_Allocator + (long)(int)_w * 4);
                } while (uVar24 != _h);
              }
              lVar30 = lVar30 + 1;
              puVar26 = (undefined4 *)((long)puVar26 + sVar16 * sVar17);
              pAVar23 = (Allocator *)
                        ((long)&pAVar23->_vptr_Allocator +
                        local_158.cstep *
                        CONCAT44(local_158.elemsize._4_4_,(undefined4)local_158.elemsize));
            } while (lVar30 < *(int *)((long)&(this->weight_winograd23_data).dims +
                                      (long)pp_Var15[-3]));
          }
          uVar27 = local_98 + 1;
          local_178 = local_178 + 4;
          local_180 = local_180 + 4;
        } while (uVar27 != uVar22);
        uVar24 = local_b0 + 1;
        bVar36 = uVar24 < uVar22;
        local_178 = local_a8 + (long)iVar8 * 4;
        local_180 = local_a0 + local_b8;
      } while (uVar24 != uVar22);
    }
LAB_0023c29a:
    pLVar18 = this->activation;
    if (pLVar18 == (Layer *)0x0) {
      iVar29 = 0;
    }
    else {
      (*pLVar18->_vptr_Layer[9])(pLVar18,top_blob,opt);
      iVar29 = 0;
    }
LAB_0023c2b9:
    piVar20 = (int *)CONCAT44(local_158.refcount._4_4_,(int)local_158.refcount);
    if (piVar20 != (int *)0x0) {
      LOCK();
      *piVar20 = *piVar20 + -1;
      UNLOCK();
      if (*piVar20 == 0) {
        if (local_158.allocator == (Allocator *)0x0) {
          if ((Allocator *)local_158.data != (Allocator *)0x0) {
            free(local_158.data);
          }
        }
        else {
          (*(local_158.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_158.cstep = 0;
    local_158.data = (void *)0x0;
    local_158.refcount._0_4_ = 0;
    local_158.refcount._4_4_ = 0;
    local_158.elemsize._0_4_ = 0;
    local_158.elemsize._4_4_ = 0;
    local_158.elempack = 0;
    local_158.dims = 0;
    local_158.w = 0;
    local_158.h = 0;
    local_158.d = 0;
    local_158.c = 0;
    piVar20 = (int *)CONCAT44(local_108.refcount._4_4_,(int)local_108.refcount);
    if (piVar20 != (int *)0x0) {
      LOCK();
      *piVar20 = *piVar20 + -1;
      UNLOCK();
      if (*piVar20 == 0) {
        if (local_108.allocator == (Allocator *)0x0) {
          if ((Allocator *)local_108.data != (Allocator *)0x0) {
            free(local_108.data);
          }
        }
        else {
          (*(local_108.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  return iVar29;
}

Assistant:

int Convolution_x86_avx::forwardDilation_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;

    const int kernel_size = kernel_w;
    const int stride = stride_w;
    const int dilation = dilation_w;
    const int kernel_extent = dilation * (kernel_size - 1) + 1;

    int outw = (w - kernel_extent) / stride + 1;
    int outh = (h - kernel_extent) / stride + 1;

    top_blob.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // Make (dilation * dilation) batches
    Mat inner_bottom_blob;
    Mat inner_top_blob;
    for (int x = 0; x < dilation; x++)
    {
        for (int y = 0; y < dilation; y++)
        {
            int inner_w = (w - y + dilation - 1) / dilation;
            int inner_h = (h - x + dilation - 1) / dilation;

            int inner_outw = (inner_w - kernel_size) / stride + 1;
            int inner_outh = (inner_h - kernel_size) / stride + 1;

            inner_bottom_blob.create(inner_w, inner_h, bottom_blob.c, elemsize, opt.workspace_allocator);
            if (inner_bottom_blob.empty())
                return -100;

            inner_top_blob.create(inner_outw, inner_outh, num_output, elemsize, opt.workspace_allocator);
            if (inner_top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int c = 0; c < bottom_blob.c; c++)
            {
                float* outptr = inner_bottom_blob.channel(c);

                for (int i = 0; i < inner_h; i++)
                {
                    const float* ptr = (const float*)bottom_blob.channel(c) + dilation * i * w + x * w + y;
                    for (int j = 0; j < inner_w; j++)
                    {
                        outptr[j] = ptr[j * dilation];
                    }
                    outptr += inner_w;
                }
            }

            Option opt_g = opt;
            opt_g.blob_allocator = inner_top_blob.allocator;
            convolution_dilation1->forward(inner_bottom_blob, inner_top_blob, opt_g);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int c = 0; c < num_output; c++)
            {
                float* outptr = (float*)top_blob.channel(c) + x * outw + y;
                for (int i = 0; i < inner_outh; i++)
                {
                    const float* ptr = (const float*)inner_top_blob.channel(c) + i * inner_outw;
                    for (int j = 0; j < inner_outw; j++)
                    {
                        outptr[j * dilation] = ptr[j];
                    }
                    outptr += dilation * outw;
                }
            }
        }
    }

    if (activation)
    {
        activation->forward_inplace(top_blob, opt);
    }

    return 0;
}